

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hh
# Opt level: O2

void __thiscall
Variant<int,std::__cxx11::string,char_const*>::move0<char_const*>
          (Variant<int,std::__cxx11::string,char_const*> *this,type_index *old_t,void *old_v,
          void *new_v)

{
  bool bVar1;
  type_index local_18;
  
  local_18._M_target = (type_info *)&char_const*::typeinfo;
  bVar1 = std::type_index::operator==(old_t,&local_18);
  if (bVar1) {
    *(undefined8 *)new_v = *old_v;
  }
  return;
}

Assistant:

void move0(const std::type_index& old_t, void *old_v, void *new_v)
	{
		if (old_t == std::type_index(typeid(T)))
			new (new_v)T(std::move(*reinterpret_cast<T*>(old_v)));
	}